

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::rc4_handler::set_outgoing_key(rc4_handler *this,span<const_char> key)

{
  span<char> vec;
  char buf [1024];
  undefined1 *local_430;
  undefined8 local_428;
  undefined1 local_420 [24];
  undefined1 local_408 [1024];
  
  this->m_encrypt = true;
  rc4_init((uchar *)key.m_ptr,key.m_len,&this->m_rc4_outgoing);
  local_430 = local_408;
  local_428 = 0x400;
  (*(this->super_crypto_plugin)._vptr_crypto_plugin[4])(local_420,this,&local_430,1);
  return;
}

Assistant:

void rc4_handler::set_outgoing_key(span<char const> key)
	{
		m_encrypt = true;
		rc4_init(reinterpret_cast<unsigned char const*>(key.data())
			, std::size_t(key.size()), &m_rc4_outgoing);
		// Discard first 1024 bytes
		char buf[1024];
		span<char> vec(buf, sizeof(buf));
		encrypt(vec);
	}